

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codadump.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  undefined4 *puVar2;
  undefined8 uVar3;
  char *definition_path;
  int i;
  char **argv_local;
  int argc_local;
  
  if (((argc != 1) && (iVar1 = strcmp(argv[1],"-h"), iVar1 != 0)) &&
     (iVar1 = strcmp(argv[1],"--help"), iVar1 != 0)) {
    iVar1 = strcmp(argv[1],"-v");
    if ((iVar1 != 0) && (iVar1 = strcmp(argv[1],"--version"), iVar1 != 0)) {
      definition_path._4_4_ = 1;
      if ((argc < 3) || (iVar1 = strcmp(argv[1],"-D"), iVar1 != 0)) {
        iVar1 = coda_set_definition_path_conditional(*argv,0,"../share/coda/definitions");
        __stream = _stderr;
        if (iVar1 != 0) {
          puVar2 = (undefined4 *)coda_get_errno();
          uVar3 = coda_errno_to_string(*puVar2);
          fprintf(__stream,"ERROR: %s\n",uVar3);
          exit(1);
        }
      }
      else {
        coda_set_definition_path(argv[2]);
        definition_path._4_4_ = 3;
      }
      iVar1 = strcmp(argv[definition_path._4_4_],"list");
      if (iVar1 == 0) {
        run_mode = RUN_MODE_LIST;
        handle_list_run_mode(argc - (definition_path._4_4_ + 1),argv + (definition_path._4_4_ + 1));
      }
      else {
        iVar1 = strcmp(argv[definition_path._4_4_],"ascii");
        if (iVar1 == 0) {
          run_mode = RUN_MODE_ASCII;
          handle_ascii_run_mode
                    (argc - (definition_path._4_4_ + 1),argv + (definition_path._4_4_ + 1));
        }
        else {
          iVar1 = strcmp(argv[definition_path._4_4_],"json");
          if (iVar1 == 0) {
            run_mode = RUN_MODE_JSON;
            handle_json_run_mode
                      (argc - (definition_path._4_4_ + 1),argv + (definition_path._4_4_ + 1));
          }
          else {
            iVar1 = strcmp(argv[definition_path._4_4_],"yaml");
            if (iVar1 == 0) {
              run_mode = RUN_MODE_YAML;
              handle_yaml_run_mode
                        (argc - (definition_path._4_4_ + 1),argv + (definition_path._4_4_ + 1));
            }
            else {
              iVar1 = strcmp(argv[definition_path._4_4_],"debug");
              if (iVar1 != 0) {
                fprintf(_stderr,"ERROR: invalid arguments\n");
                print_help();
                exit(1);
              }
              run_mode = RUN_MODE_DEBUG;
              handle_debug_run_mode
                        (argc - (definition_path._4_4_ + 1),argv + (definition_path._4_4_ + 1));
            }
          }
        }
      }
      return 0;
    }
    print_version();
    exit(0);
  }
  print_help();
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
    int i;

    if (argc == 1 || strcmp(argv[1], "-h") == 0 || strcmp(argv[1], "--help") == 0)
    {
        print_help();
        exit(0);
    }

    if (strcmp(argv[1], "-v") == 0 || strcmp(argv[1], "--version") == 0)
    {
        print_version();
        exit(0);
    }

    i = 1;
    if (i + 1 < argc && strcmp(argv[i], "-D") == 0)
    {
        coda_set_definition_path(argv[i + 1]);
        i += 2;
    }
    else
    {
        const char *definition_path = "../share/" PACKAGE "/definitions";

        if (coda_set_definition_path_conditional(argv[0], NULL, definition_path) != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }
    }

    if (strcmp(argv[i], "list") == 0)
    {
        run_mode = RUN_MODE_LIST;
        i++;
        handle_list_run_mode(argc - i, &argv[i]);
    }
    else if (strcmp(argv[i], "ascii") == 0)
    {
        run_mode = RUN_MODE_ASCII;
        i++;
        handle_ascii_run_mode(argc - i, &argv[i]);
    }
#ifdef HAVE_HDF4
    else if (strcmp(argv[i], "hdf4") == 0)
    {
        run_mode = RUN_MODE_HDF4;
        i++;
        handle_hdf4_run_mode(argc - i, &argv[i]);
    }
#endif
    else if (strcmp(argv[i], "json") == 0)
    {
        run_mode = RUN_MODE_JSON;
        i++;
        handle_json_run_mode(argc - i, &argv[i]);
    }
    else if (strcmp(argv[i], "yaml") == 0)
    {
        run_mode = RUN_MODE_YAML;
        i++;
        handle_yaml_run_mode(argc - i, &argv[i]);
    }
    else if (strcmp(argv[i], "debug") == 0)
    {
        run_mode = RUN_MODE_DEBUG;
        i++;
        handle_debug_run_mode(argc - i, &argv[i]);
    }
    else
    {
        fprintf(stderr, "ERROR: invalid arguments\n");
        print_help();
        exit(1);
    }

    return 0;
}